

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::BufferWriteTests::init(BufferWriteTests *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  deUint32 dVar2;
  Context *pCVar3;
  deUint32 dVar4;
  uint uVar5;
  TestNode *pTVar6;
  char *pcVar7;
  int (*paiVar8) [2];
  long *plVar9;
  BufferCase *pBVar10;
  RecreateBufferDataStoreCase *pRVar11;
  DataStoreSpec *specs;
  SubDataToUndefinedCase *pSVar12;
  int extraout_RAX [2];
  int aiVar13 [2];
  size_type *psVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  deUint32 target;
  DataStoreSpec *pDVar19;
  int iVar20;
  undefined1 local_280 [16];
  long local_270;
  int aiStack_268 [2];
  DataStoreSpec local_260;
  undefined4 uStack_254;
  ulong local_250 [2];
  DataStoreSpec local_240;
  undefined4 uStack_234;
  ulong local_230 [2];
  DataStoreSpec local_220;
  DataStoreSpec local_214;
  Random rnd;
  DataStoreSpec local_1ec;
  DataStoreSpec local_1e0;
  DataStoreSpec local_1d4;
  string name;
  ios_base local_158 [276];
  DataStoreSpec local_44;
  TestNode *local_38;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic upload with glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar15 = 0;
  do {
    dVar4 = BufferCopyTests::init::bufferTargets[lVar15];
    lVar16 = 0;
    do {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,pcVar7,(allocator<char> *)&local_240);
      paiVar8 = (int (*) [2])std::__cxx11::string::append((char *)&local_260);
      local_280._0_8_ = &local_270;
      aiVar13 = (int  [2])(paiVar8 + 2);
      if (*paiVar8 == aiVar13) {
        local_270 = *(long *)aiVar13;
        aiStack_268 = paiVar8[3];
      }
      else {
        local_270 = *(long *)aiVar13;
        local_280._0_8_ = *paiVar8;
      }
      local_280._8_8_ = paiVar8[1];
      *paiVar8 = aiVar13;
      paiVar8[1] = (int  [2])0x0;
      *(undefined1 *)paiVar8[2] = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      plVar9 = (long *)std::__cxx11::string::append(local_280);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar14 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar14) {
        name.field_2._M_allocated_capacity = *psVar14;
        name.field_2._8_8_ = plVar9[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar14;
        name._M_dataplus._M_p = (pointer)*plVar9;
      }
      name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((long *)local_280._0_8_ != &local_270) {
        operator_delete((void *)local_280._0_8_,local_270 + 1);
      }
      if ((ulong *)local_260._0_8_ != local_250) {
        operator_delete((void *)local_260._0_8_,local_250[0] + 1);
      }
      pBVar10 = (BufferCase *)operator_new(0xd0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,name._M_dataplus._M_p,
                 ::glcts::fixed_sample_locations_values + 1);
      (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_02152d48;
      *(deUint32 *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = dVar4;
      *(deUint32 *)((long)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pBVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fc;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x24);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 8);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "recreate_store","Data store recreate using glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_280._0_4_ = 0x8892;
  local_280._4_4_ = 0x88e4;
  local_280._8_4_ = 0x3e4;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_280);
  local_260.target = 0x8892;
  local_260.usage = 0x88e4;
  local_260.size = 0x3e4;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_260);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x3e4;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_240.target = 0x8892;
  local_240.usage = 0x88e4;
  local_240.size = 0x3e4;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_240);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x3e4;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar11,(this->super_TestCaseGroup).m_context,"identical_1",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar11);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_280._0_4_ = 0x8f37;
  local_280._4_4_ = 0x88e4;
  local_280._8_4_ = 0x48;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_280);
  local_260.target = 0x8f37;
  local_260.usage = 0x88e4;
  local_260.size = 0x48;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_260);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x48;
    *(undefined8 *)name._M_string_length = 0x88e400008f37;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_240.target = 0x8f37;
  local_240.usage = 0x88e4;
  local_240.size = 0x48;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_240);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x48;
    *(undefined8 *)name._M_string_length = 0x88e400008f37;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar11,(this->super_TestCaseGroup).m_context,"identical_2",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar11);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_280._0_4_ = 0x8892;
  local_280._4_4_ = 0x88e4;
  local_280._8_4_ = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_280);
  local_260.target = 0x8f36;
  local_260.usage = 0x88e4;
  local_260.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_260);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008f36;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_240.target = 0x8f37;
  local_240.usage = 0x88e4;
  local_240.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_240);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008f37;
    name._M_string_length = name._M_string_length + 0xc;
  }
  rnd.m_rnd.x = 0x8893;
  rnd.m_rnd.y = 0x88e4;
  rnd.m_rnd.z = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&rnd);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008893;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_214.target = 0x88eb;
  local_214.usage = 0x88e4;
  local_214.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_214);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e4000088eb;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_220.target = 0x88ec;
  local_220.usage = 0x88e4;
  local_220.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_220);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e4000088ec;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1d4.target = 0x8c8e;
  local_1d4.usage = 0x88e4;
  local_1d4.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1d4);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008c8e;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1e0.target = 0x8a11;
  local_1e0.usage = 0x88e4;
  local_1e0.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1e0);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008a11;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1ec.target = 0x8892;
  local_1ec.usage = 0x88e4;
  local_1ec.size = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1ec);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar11,(this->super_TestCaseGroup).m_context,"different_target",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar11);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_280._0_4_ = 0x8892;
  local_280._4_4_ = 0x88e0;
  local_280._8_4_ = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_280);
  local_260.target = 0x8892;
  local_260.usage = 0x88e2;
  local_260.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_260);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e200008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_240.target = 0x8892;
  local_240.usage = 0x88e5;
  local_240.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_240);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e500008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  rnd.m_rnd.x = 0x8892;
  rnd.m_rnd.y = 0x88e1;
  rnd.m_rnd.z = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&rnd);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e100008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_214.target = 0x8892;
  local_214.usage = 0x88ea;
  local_214.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_214);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88ea00008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_220.target = 0x8892;
  local_220.usage = 0x88e6;
  local_220.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_220);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e600008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1d4.target = 0x8892;
  local_1d4.usage = 0x88e9;
  local_1d4.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1d4);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e900008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1e0.target = 0x8892;
  local_1e0.usage = 0x88e8;
  local_1e0.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1e0);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e800008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_1ec.target = 0x8892;
  local_1ec.usage = 0x88e4;
  local_1ec.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_1ec);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_44.target = 0x8892;
  local_44.usage = 0x88e0;
  local_44.size = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_44);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar11,(this->super_TestCaseGroup).m_context,"different_usage",
             "Recreate with different usage",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar11);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_280._0_4_ = 0x8892;
  local_280._4_4_ = 0x88e0;
  local_280._8_4_ = 0x400;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_280);
  local_260._0_8_ = (ulong *)0x88e000008892;
  local_260.size = 0xc;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_260);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0xc;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_240._0_8_ = (ulong *)0x88e000008892;
  local_240.size = 0xcff;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_240);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0xcff;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  rnd.m_rnd.x = 0x8892;
  rnd.m_rnd.y = 0x88e0;
  rnd.m_rnd.z = 0x5c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&rnd);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x5c;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_214.target = 0x8892;
  local_214.usage = 0x88e0;
  local_214.size = 0x1e393;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_214);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1e393;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_220.target = 0x8892;
  local_220.usage = 0x88e0;
  local_220.size = 0x23b;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles3::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_220);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x23b;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar11,(this->super_TestCaseGroup).m_context,"different_size",
             "Recreate with different size",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar11);
  local_38 = pTVar6;
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  deRandom_init(&rnd.m_rnd,0x5d71);
  iVar20 = 0;
  do {
    specs = (DataStoreSpec *)operator_new(0x78);
    specs[8].target = 0;
    specs[8].usage = 0;
    *(undefined8 *)&specs[8].size = 0;
    *(undefined8 *)&specs[6].size = 0;
    specs[7].usage = 0;
    specs[7].size = 0;
    specs[5].usage = 0;
    specs[5].size = 0;
    specs[6].target = 0;
    specs[6].usage = 0;
    specs[4].target = 0;
    specs[4].usage = 0;
    *(undefined8 *)&specs[4].size = 0;
    *(undefined8 *)&specs[2].size = 0;
    specs[3].usage = 0;
    specs[3].size = 0;
    specs[1].usage = 0;
    specs[1].size = 0;
    specs[2].target = 0;
    specs[2].usage = 0;
    specs->target = 0;
    specs->usage = 0;
    *(undefined8 *)&specs->size = 0;
    specs[9].usage = 0;
    specs[9].size = 0;
    pDVar19 = specs;
    do {
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->target = BufferCopyTests::init::bufferTargets[dVar4 & 7];
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->usage = init::usageHints[dVar4 % 9];
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->size = dVar4 % 0xfff5 + 0xc;
      pDVar19 = pDVar19 + 1;
    } while (pDVar19 != specs + 10);
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    local_260._0_8_ = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"random_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    iVar20 = iVar20 + 1;
    std::ostream::operator<<(&name,iVar20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::ios_base::~ios_base(local_158);
    uVar18 = 0xf;
    if ((ulong *)local_260._0_8_ != local_250) {
      uVar18 = local_250[0];
    }
    uVar1 = CONCAT44(uStack_234,local_240.size) + CONCAT44(uStack_254,local_260.size);
    if (uVar18 < uVar1) {
      uVar18 = 0xf;
      if ((ulong *)local_240._0_8_ != local_230) {
        uVar18 = local_230[0];
      }
      if (uVar18 < uVar1) goto LAB_012866dd;
      paiVar8 = (int (*) [2])
                std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,local_260._0_8_);
    }
    else {
LAB_012866dd:
      paiVar8 = (int (*) [2])std::__cxx11::string::_M_append((char *)&local_260,local_240._0_8_);
    }
    local_280._0_8_ = &local_270;
    aiVar13 = (int  [2])(paiVar8 + 2);
    if (*paiVar8 == aiVar13) {
      local_270 = *(long *)aiVar13;
      aiStack_268 = paiVar8[3];
    }
    else {
      local_270 = *(long *)aiVar13;
      local_280._0_8_ = *paiVar8;
    }
    local_280._8_8_ = paiVar8[1];
    *paiVar8 = aiVar13;
    paiVar8[1] = (int  [2])0x0;
    *(undefined1 *)aiVar13 = 0;
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar3,(char *)local_280._0_8_,::glcts::fixed_sample_locations_values + 1,
               specs,10,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(local_38,(TestNode *)pRVar11);
    if ((long *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270 + 1);
    }
    if ((ulong *)local_240._0_8_ != local_230) {
      operator_delete((void *)local_240._0_8_,local_230[0] + 1);
    }
    if ((ulong *)local_260._0_8_ != local_250) {
      operator_delete((void *)local_260._0_8_,local_250[0] + 1);
    }
    operator_delete(specs,0x78);
    if (iVar20 == 4) {
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "basic_subdata","Basic glBufferSubData() usage");
      tcu::TestNode::addChild((TestNode *)this,pTVar6);
      lVar15 = 0;
      do {
        dVar4 = BufferCopyTests::init::bufferTargets[lVar15];
        lVar16 = 0;
        do {
          dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
          pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,pcVar7,(allocator<char> *)&local_240);
          paiVar8 = (int (*) [2])std::__cxx11::string::append((char *)&local_260);
          local_280._0_8_ = &local_270;
          aiVar13 = (int  [2])(paiVar8 + 2);
          if (*paiVar8 == aiVar13) {
            local_270 = *(long *)aiVar13;
            aiStack_268 = paiVar8[3];
          }
          else {
            local_270 = *(long *)aiVar13;
            local_280._0_8_ = *paiVar8;
          }
          local_280._8_8_ = paiVar8[1];
          *paiVar8 = aiVar13;
          paiVar8[1] = (int  [2])0x0;
          *(undefined1 *)paiVar8[2] = 0;
          deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
          plVar9 = (long *)std::__cxx11::string::append(local_280);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar14 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar14) {
            name.field_2._M_allocated_capacity = *psVar14;
            name.field_2._8_8_ = plVar9[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar14;
            name._M_dataplus._M_p = (pointer)*plVar9;
          }
          name._M_string_length = plVar9[1];
          *plVar9 = (long)psVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((long *)local_280._0_8_ != &local_270) {
            operator_delete((void *)local_280._0_8_,local_270 + 1);
          }
          if ((ulong *)local_260._0_8_ != local_250) {
            operator_delete((void *)local_260._0_8_,local_250[0] + 1);
          }
          pBVar10 = (BufferCase *)operator_new(0xd0);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          deqp::gls::BufferTestUtil::BufferCase::BufferCase
                    (pBVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,name._M_dataplus._M_p,
                     ::glcts::fixed_sample_locations_values + 1);
          (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__BufferCase_02152d48;
          *(deUint32 *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = dVar4;
          *(deUint32 *)((long)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
          pBVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fc;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x24);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "partial_specify","Partial buffer data specification with glBufferSubData()");
      tcu::TestNode::addChild((TestNode *)this,pTVar6);
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 0x3e4;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"whole_1",
                 "Whole buffer specification with single glBufferSubData()",0x8892,0x88e4,0x3e4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0x2d9;
      local_280._4_4_ = 999;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0;
      local_260.usage = 0x2d9;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"whole_2",
                 "Whole buffer specification with two calls",0x8a11,0x88e9,0x6c0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 0x1a5;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x58d;
      local_260.usage = 0x20b;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      local_240.target = 0x1a5;
      local_240.usage = 1000;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_240);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"whole_3",
                 "Whole buffer specification with three calls",0x8c8e,0x88e2,0x798,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 500;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x1ad;
      local_260.usage = 200;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      local_240.target = 0x201;
      local_240.usage = 0x2af;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_240);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"whole_4",
                 "Whole buffer specification with three calls",0x8c8e,0x88e2,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 0x201;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"low_1",
                 "Low part of buffer specified with single call",0x8893,0x88e8,1000,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 0x62;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x62;
      local_260.usage = 0x1ff;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"low_2",
                 "Low part of buffer specified with two calls",0x8f36,0x88ea,0x3e4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0;
      local_280._4_4_ = 0x24f;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x173;
      local_260.usage = 400;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"low_3",
                 "Low part of buffer specified with two calls",0x8f36,0x88ea,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 500;
      local_280._4_4_ = 500;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"high_1",
                 "High part of buffer specified with single call",0x8f37,0x88e6,1000,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 600;
      local_280._4_4_ = 0x7b;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x2d3;
      local_260.usage = 0x1dd;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"high_2",
                 "High part of buffer specified with two calls",0x8c8e,0x88e0,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 600;
      local_280._4_4_ = 200;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 0x259;
      local_260.usage = 599;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"high_3",
                 "High part of buffer specified with two calls",0x88eb,0x88e1,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 1000;
      local_280._4_4_ = 799;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"middle_1",
                 "Middle part of buffer specified with single call",0x88ec,0x88e1,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0x30c;
      local_280._4_4_ = 0xdc;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 1000;
      local_260.usage = 500;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"middle_2",
                 "Middle part of buffer specified with two calls",0x8893,0x88e4,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_280._0_4_ = 0x30c;
      local_280._4_4_ = 0x141;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_280);
      local_260.target = 1000;
      local_260.usage = 0x1f5;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_260);
      pSVar12 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar12,(this->super_TestCaseGroup).m_context,"middle_3",
                 "Middle part of buffer specified with two calls",0x8892,0x88e1,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar12);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
                 "Randomized buffer data cases");
      tcu::TestNode::addChild((TestNode *)this,pTVar6);
      uVar17 = 0;
      do {
        pBVar10 = (BufferCase *)operator_new(0x110);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::ostream::operator<<(&name,uVar17);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_158);
        deqp::gls::BufferTestUtil::BufferCase::BufferCase
                  (pBVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_280._0_8_,
                   ::glcts::fixed_sample_locations_values + 1);
        uVar5 = (uVar17 ^ 0x3d) * 9;
        uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
        (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__RandomBufferWriteCase_02152e38;
        *(uint *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = uVar5 >> 0xf ^ uVar5;
        pBVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        *(undefined4 *)&pBVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
        pBVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
        pBVar10[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
        pBVar10[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
        pBVar10[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pBVar10[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
        aiVar13 = (int  [2])&local_270;
        if ((int  [2])local_280._0_8_ != aiVar13) {
          operator_delete((void *)local_280._0_8_,local_270 + 1);
          aiVar13 = extraout_RAX;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 10);
      return aiVar13[0];
    }
  } while( true );
}

Assistant:

void BufferWriteTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STREAM_READ,
		GL_STREAM_COPY,
		GL_STATIC_DRAW,
		GL_STATIC_READ,
		GL_STATIC_COPY,
		GL_DYNAMIC_DRAW,
		GL_DYNAMIC_READ,
		GL_DYNAMIC_COPY
	};

	// .basic
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic upload with glBufferData()");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .recreate_store
	{
		tcu::TestCaseGroup* const recreateStoreGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_store", "Data store recreate using glBufferData()");
		addChild(recreateStoreGroup);

#define RECREATE_STORE_CASE(NAME, DESC, SPECLIST)																												\
		do {																																				\
			std::vector<DataStoreSpec> specs;																												\
			DataStoreSpecVecBuilder builder(specs);																											\
			builder SPECLIST;																																\
			recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, #NAME, DESC, &specs[0], (int)specs.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		RECREATE_STORE_CASE(identical_1, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996));

		RECREATE_STORE_CASE(identical_2, "Recreate with identical parameters",
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72));

		RECREATE_STORE_CASE(different_target, "Recreate with different target",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_COPY_READ_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_PIXEL_PACK_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_PIXEL_UNPACK_BUFFER,		GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_TRANSFORM_FEEDBACK_BUFFER,	GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_UNIFORM_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504));

		RECREATE_STORE_CASE(different_usage, "Recreate with different usage",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_COPY,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_READ,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_READ,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_COPY,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_COPY,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_READ,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1644));

		RECREATE_STORE_CASE(different_size, "Recreate with different size",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1024)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		12)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		3327)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		92)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		123795)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		571));

#undef RECREATE_STORE_CASE

		// Random cases.
		{
			const int			numRandomCases		= 4;
			const int			numUploadsPerCase	= 10;
			const int			minSize				= 12;
			const int			maxSize				= 65536;
			const VerifyType	verify				= VERIFY_AS_VERTEX_ARRAY;
			de::Random			rnd					(23921);

			for (int caseNdx = 0; caseNdx < numRandomCases; caseNdx++)
			{
				vector<DataStoreSpec> specs(numUploadsPerCase);

				for (vector<DataStoreSpec>::iterator spec = specs.begin(); spec != specs.end(); spec++)
				{
					spec->target	= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
					spec->usage		= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
					spec->size		= rnd.getInt(minSize, maxSize);
				}

				recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, (string("random_") + de::toString(caseNdx+1)).c_str(), "", &specs[0], (int)specs.size(), verify));
			}
		}
	}

	// .basic_subdata
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic_subdata", "Basic glBufferSubData() usage");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .partial_specify
	{
		tcu::TestCaseGroup* const partialSpecifyGroup = new tcu::TestCaseGroup(m_testCtx, "partial_specify", "Partial buffer data specification with glBufferSubData()");
		addChild(partialSpecifyGroup);

#define PARTIAL_SPECIFY_CASE(NAME, DESC, TARGET, USAGE, SIZE, RANGELIST)																									\
		do {																																								\
			std::vector<tcu::IVec2> ranges;																																	\
			RangeVecBuilder builder(ranges);																																\
			builder RANGELIST;																																				\
			partialSpecifyGroup->addChild(new SubDataToUndefinedCase(m_context, #NAME, DESC, TARGET, USAGE, SIZE, &ranges[0], (int)ranges.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		PARTIAL_SPECIFY_CASE(whole_1, "Whole buffer specification with single glBufferSubData()", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 996));
		PARTIAL_SPECIFY_CASE(whole_2, "Whole buffer specification with two calls", GL_UNIFORM_BUFFER, GL_DYNAMIC_READ, 1728,
			<< IVec2(729, 999)
			<< IVec2(0, 729));
		PARTIAL_SPECIFY_CASE(whole_3, "Whole buffer specification with three calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_COPY, 1944,
			<< IVec2(0, 421)
			<< IVec2(1421, 523)
			<< IVec2(421, 1000));
		PARTIAL_SPECIFY_CASE(whole_4, "Whole buffer specification with three calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_COPY, 1200,
			<< IVec2(0, 500)
			<< IVec2(429, 200)
			<< IVec2(513, 687));

		PARTIAL_SPECIFY_CASE(low_1, "Low part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1000,
			<< IVec2(0, 513));
		PARTIAL_SPECIFY_CASE(low_2, "Low part of buffer specified with two calls", GL_COPY_READ_BUFFER, GL_DYNAMIC_COPY, 996,
			<< IVec2(0, 98)
			<< IVec2(98, 511));
		PARTIAL_SPECIFY_CASE(low_3, "Low part of buffer specified with two calls", GL_COPY_READ_BUFFER, GL_DYNAMIC_COPY, 1200,
			<< IVec2(0, 591)
			<< IVec2(371, 400));

		PARTIAL_SPECIFY_CASE(high_1, "High part of buffer specified with single call", GL_COPY_WRITE_BUFFER, GL_STATIC_COPY, 1000,
			<< IVec2(500, 500));
		PARTIAL_SPECIFY_CASE(high_2, "High part of buffer specified with two calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 123)
			<< IVec2(723, 477));
		PARTIAL_SPECIFY_CASE(high_3, "High part of buffer specified with two calls", GL_PIXEL_PACK_BUFFER, GL_STREAM_READ, 1200,
			<< IVec2(600, 200)
			<< IVec2(601, 599));

		PARTIAL_SPECIFY_CASE(middle_1, "Middle part of buffer specified with single call", GL_PIXEL_UNPACK_BUFFER, GL_STREAM_READ, 2500,
			<< IVec2(1000, 799));
		PARTIAL_SPECIFY_CASE(middle_2, "Middle part of buffer specified with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 2500,
			<< IVec2(780, 220)
			<< IVec2(1000, 500));
		PARTIAL_SPECIFY_CASE(middle_3, "Middle part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_READ, 2500,
			<< IVec2(780, 321)
			<< IVec2(1000, 501));

#undef PARTIAL_SPECIFY_CASE
	}

	// .random
	{
		tcu::TestCaseGroup* const randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized buffer data cases");
		addChild(randomGroup);

		for (int i = 0; i < 10; i++)
			randomGroup->addChild(new RandomBufferWriteCase(m_context, de::toString(i).c_str(), "", deInt32Hash(i)));
	}
}